

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.cpp
# Opt level: O3

void __thiscall wasm::HeapType::HeapType(HeapType *this,Continuation continuation)

{
  undefined8 uVar1;
  HeapType HVar2;
  undefined8 local_20;
  
  HVar2 = continuation.type.id;
  local_20 = operator_new(0x50);
  ((HeapTypeInfo *)local_20)->isTemp = false;
  ((HeapTypeInfo *)local_20)->isOpen = false;
  ((HeapTypeInfo *)local_20)->share = Unshared;
  ((HeapTypeInfo *)local_20)->supertype = (HeapTypeInfo *)0x0;
  ((HeapTypeInfo *)local_20)->descriptor = (HeapTypeInfo *)0x0;
  ((HeapTypeInfo *)local_20)->described = (HeapTypeInfo *)0x0;
  ((HeapTypeInfo *)local_20)->recGroup = (RecGroupInfo_conflict *)0x0;
  ((HeapTypeInfo *)local_20)->recGroupIndex = 0;
  ((HeapTypeInfo *)local_20)->kind = Cont;
  (((HeapTypeInfo *)local_20)->field_9).continuation.type.id = (uintptr_t)continuation.type.id;
  HVar2 = anon_unknown_0::RecGroupStore::insert((RecGroupStore *)&stack0xffffffffffffffe0,HVar2.id);
  uVar1 = local_20;
  this->id = (uintptr_t)HVar2;
  if ((HeapTypeInfo *)local_20 != (HeapTypeInfo *)0x0) {
    anon_unknown_0::HeapTypeInfo::~HeapTypeInfo((HeapTypeInfo *)local_20);
    operator_delete((void *)uVar1,0x50);
    return;
  }
  return;
}

Assistant:

HeapType::HeapType(Continuation continuation) {
  new (this) HeapType(
    globalRecGroupStore.insert(std::make_unique<HeapTypeInfo>(continuation)));
}